

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int isViableEndCityTerrain(Generator *g,SurfaceNoise *sn,int blockX,int blockZ)

{
  EndNoise *en;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  double *column;
  double *ncol10;
  uint x;
  uint z;
  long lVar7;
  double *ncol11;
  double *ncol10_00;
  uint x_00;
  uint z_00;
  double dx;
  double dz;
  double ncol [3] [3] [4];
  double local_158 [4];
  double local_138 [4];
  double local_118 [4];
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  double local_78 [4];
  double local_58 [5];
  
  en = &g->en;
  x = blockX >> 3 & 0xfffffffe;
  z = blockZ >> 3 & 0xfffffffe;
  sampleNoiseColumnEnd(local_158,sn,en,x,z,0xf,0x12);
  z_00 = blockZ >> 3 | 1;
  sampleNoiseColumnEnd(local_138,sn,en,x,z_00,0xf,0x12);
  x_00 = blockX >> 3 | 1;
  sampleNoiseColumnEnd(local_f8,sn,en,x_00,z,0xf,0x12);
  sampleNoiseColumnEnd(local_d8,sn,en,x_00,z_00,0xf,0x12);
  iVar1 = getSurfaceHeight(local_158,local_138,local_f8,local_d8,0xf,0x12,4,0.875,0.875);
  if ((g->en).mc < 0x17) {
    switch((uint)(((long)(blockZ >> 4) * 0x9e7f71 + (long)(blockX >> 4) ^ 0x5deece66dU) *
                  0x5deece66d + 0xb >> 0x2e) & 3) {
    case 1:
switchD_0010f434_caseD_1:
      sampleNoiseColumnEnd(local_118,sn,en,x,z + 2,0xf,0x12);
      column = local_b8;
      sampleNoiseColumnEnd(column,sn,en,x_00,z + 2,0xf,0x12);
      ncol10_00 = local_138;
      ncol10 = local_d8;
      iVar2 = getSurfaceHeight(ncol10_00,local_118,ncol10,column,0xf,0x12,4,0.875,0.5);
      iVar3 = getSurfaceHeight(local_158,ncol10_00,local_f8,ncol10,0xf,0x12,4,0.25,0.875);
      ncol11 = local_118;
      dx = 0.25;
      dz = 0.5;
      goto LAB_0010f950;
    case 2:
switchD_0010f434_caseD_2:
      ncol10_00 = local_158;
      ncol11 = local_138;
      ncol10 = local_f8;
      column = local_d8;
      iVar2 = getSurfaceHeight(ncol10_00,ncol11,ncol10,column,0xf,0x12,4,0.875,0.25);
      iVar3 = getSurfaceHeight(ncol10_00,ncol11,ncol10,column,0xf,0x12,4,0.25,0.875);
      dx = 0.25;
      dz = dx;
      goto LAB_0010f950;
    case 3:
switchD_0010f434_caseD_3:
      sampleNoiseColumnEnd(local_98,sn,en,x + 2,z,0xf,0x12);
      column = local_78;
      sampleNoiseColumnEnd(column,sn,en,x + 2,z_00,0xf,0x12);
      ncol10_00 = local_f8;
      ncol11 = local_d8;
      iVar2 = getSurfaceHeight(local_158,local_138,ncol10_00,ncol11,0xf,0x12,4,0.875,0.25);
      iVar3 = getSurfaceHeight(ncol10_00,ncol11,local_98,column,0xf,0x12,4,0.5,0.875);
      ncol10 = local_98;
      dx = 0.5;
      dz = 0.25;
      goto LAB_0010f950;
    }
  }
  else {
    lVar5 = (g->seed ^ 0x5deece66d) * 0x5deece66d + 0xb;
    uVar6 = lVar5 * 0x5deece66d + 0xb;
    lVar7 = (uVar6 & 0xffffffffffff) * 0x5deece66d + 0xb;
    switch((uint)(((long)(blockX >> 4) *
                   ((long)(int)(uVar6 >> 0x10) + (ulong)((uint)lVar5 & 0xffff0000) * 0x10000) ^
                   g->seed ^ 0x5deece66d ^
                  (long)(blockZ >> 4) *
                  ((lVar7 * 0x5deece66d0000 + 0xb0000 >> 0x20) +
                  (ulong)((uint)lVar7 & 0xffff0000) * 0x10000)) * 0x5deece66d + 0xb >> 0x2e) & 3) {
    case 1:
      goto switchD_0010f434_caseD_1;
    case 2:
      goto switchD_0010f434_caseD_2;
    case 3:
      goto switchD_0010f434_caseD_3;
    }
  }
  iVar2 = z + 2;
  sampleNoiseColumnEnd(local_118,sn,en,x,iVar2,0xf,0x12);
  sampleNoiseColumnEnd(local_b8,sn,en,x_00,iVar2,0xf,0x12);
  iVar3 = x + 2;
  sampleNoiseColumnEnd(local_98,sn,en,iVar3,z,0xf,0x12);
  ncol10 = local_78;
  sampleNoiseColumnEnd(ncol10,sn,en,iVar3,z_00,0xf,0x12);
  sampleNoiseColumnEnd(local_58,sn,en,iVar3,iVar2,0xf,0x12);
  ncol10_00 = local_d8;
  ncol11 = local_b8;
  iVar2 = getSurfaceHeight(local_138,local_118,ncol10_00,ncol11,0xf,0x12,4,0.875,0.5);
  iVar3 = getSurfaceHeight(local_f8,ncol10_00,local_98,ncol10,0xf,0x12,4,0.5,0.875);
  column = local_58;
  dx = 0.5;
  dz = dx;
LAB_0010f950:
  iVar4 = getSurfaceHeight(ncol10_00,ncol11,ncol10,column,0xf,0x12,4,dx,dz);
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  if (iVar3 < iVar1) {
    iVar1 = iVar3;
  }
  if (iVar4 < iVar1) {
    iVar1 = iVar4;
  }
  iVar2 = 0;
  if (0x3b < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int isViableEndCityTerrain(const Generator *g, const SurfaceNoise *sn,
        int blockX, int blockZ)
{
    const EndNoise *en = &g->en;
    int chunkX = blockX >> 4;
    int chunkZ = blockZ >> 4;
    blockX = chunkX * 16 + 7;
    blockZ = chunkZ * 16 + 7;
    int cellx = (blockX >> 3);
    int cellz = (blockZ >> 3);

    enum { y0 = 15, y1 = 18, yn = y1-y0+1 };
    double ncol[3][3][yn];

    sampleNoiseColumnEnd(ncol[0][0], sn, en, cellx, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[0][1], sn, en, cellx, cellz+1, y0, y1);
    sampleNoiseColumnEnd(ncol[1][0], sn, en, cellx+1, cellz, y0, y1);
    sampleNoiseColumnEnd(ncol[1][1], sn, en, cellx+1, cellz+1, y0, y1);

    int h00, h01, h10, h11;
    h00 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
            y0, y1, 4, (blockX & 7) / 8.0, (blockZ & 7) / 8.0);

    uint64_t cs;
    if (en->mc <= MC_1_18)
        setSeed(&cs, chunkX + chunkZ * 10387313ULL);
    else
        cs = chunkGenerateRnd(g->seed, chunkX, chunkZ);

    switch (nextInt(&cs, 4))
    {
    case 0: // (++) 0
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        sampleNoiseColumnEnd(ncol[2][2], sn, en, cellx+2, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][1], ncol[1][2], ncol[2][1], ncol[2][2],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 1: // (-+) 90
        sampleNoiseColumnEnd(ncol[0][2], sn, en, cellx+0, cellz+2, y0, y1);
        sampleNoiseColumnEnd(ncol[1][2], sn, en, cellx+1, cellz+2, y0, y1);
        h01 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][1], ncol[0][2], ncol[1][1], ncol[1][2],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ + 5) & 7) / 8.0);
        break;

    case 2: // (--) 180
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX - 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    case 3: // (+-) 270
        sampleNoiseColumnEnd(ncol[2][0], sn, en, cellx+2, cellz+0, y0, y1);
        sampleNoiseColumnEnd(ncol[2][1], sn, en, cellx+2, cellz+1, y0, y1);
        h01 = getSurfaceHeight(ncol[0][0], ncol[0][1], ncol[1][0], ncol[1][1],
                y0, y1, 4, ((blockX    ) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        h10 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ    ) & 7) / 8.0);
        h11 = getSurfaceHeight(ncol[1][0], ncol[1][1], ncol[2][0], ncol[2][1],
                y0, y1, 4, ((blockX + 5) & 7) / 8.0, ((blockZ - 5) & 7) / 8.0);
        break;

    default:
        return 0; // error
    }
    //printf("%d %d %d %d\n", h00, h01, h10, h11);
    if (h01 < h00) h00 = h01;
    if (h10 < h00) h00 = h10;
    if (h11 < h00) h00 = h11;
    return h00 >= 60 ? h00 : 0;
}